

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O2

int CfdVerifyConfidentialTxSignature
              (void *handle,char *tx_hex,char *signature,char *pubkey,char *script,char *txid,
              uint32_t vout,int sighash_type,bool sighash_anyone_can_pay,int64_t value_satoshi,
              char *value_commitment,int witness_version)

{
  SigHashType sighash_type_00;
  bool bVar1;
  CfdException *pCVar2;
  int iVar3;
  Script *this;
  Amount AVar4;
  undefined4 uVar5;
  WitnessVersion version;
  allocator local_1aa;
  allocator local_1a9;
  Script local_1a8;
  void *local_170;
  undefined1 local_168 [36];
  SigHashType sighash_type_obj;
  ConfidentialTransactionController ctxc;
  ByteData signature_obj;
  ConfidentialValue value;
  string local_a8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  SigHashType local_6c;
  Txid txid_obj;
  SigHashType local_3c;
  
  local_170 = handle;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(tx_hex);
  if (bVar1) {
    ctxc.super_AbstractTransactionController._vptr_AbstractTransactionController =
         (_func_int **)0x4fbb12;
    ctxc.super_AbstractTransactionController.tx_address_._0_4_ = 0x839;
    ctxc.transaction_.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)anon_var_dwarf_772da1;
    cfd::core::logger::warn<>((CfdSourceLocation *)&ctxc,"tx is null or empty.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&ctxc,"Failed to parameter. tx is null or empty.",(allocator *)&local_1a8);
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&ctxc);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(signature);
  if (bVar1) {
    ctxc.super_AbstractTransactionController._vptr_AbstractTransactionController =
         (_func_int **)0x4fbb12;
    ctxc.super_AbstractTransactionController.tx_address_._0_4_ = 0x83f;
    ctxc.transaction_.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)anon_var_dwarf_772da1;
    cfd::core::logger::warn<>((CfdSourceLocation *)&ctxc,"signature is null or empty.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&ctxc,"Failed to parameter. signature is null or empty.",
               (allocator *)&local_1a8);
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&ctxc);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(pubkey);
  if (bVar1) {
    ctxc.super_AbstractTransactionController._vptr_AbstractTransactionController =
         (_func_int **)0x4fbb12;
    ctxc.super_AbstractTransactionController.tx_address_._0_4_ = 0x845;
    ctxc.transaction_.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)anon_var_dwarf_772da1;
    cfd::core::logger::warn<>((CfdSourceLocation *)&ctxc,"pubkey is null or empty.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&ctxc,"Failed to parameter. pubkey is null or empty.",
               (allocator *)&local_1a8);
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&ctxc);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  std::__cxx11::string::string((string *)&local_1a8,tx_hex,(allocator *)&value);
  cfd::ConfidentialTransactionController::ConfidentialTransactionController
            (&ctxc,(string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::string((string *)&local_1a8,signature,(allocator *)&value);
  cfd::core::ByteData::ByteData(&signature_obj,(string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::string((string *)&local_1a8,txid,(allocator *)&value);
  cfd::core::Txid::Txid(&txid_obj,(string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  cfd::core::SigHashType::Create
            (&sighash_type_obj,(uint8_t)sighash_type,sighash_anyone_can_pay,false);
  cfd::core::ConfidentialValue::ConfidentialValue(&value);
  bVar1 = cfd::capi::IsEmptyString(value_commitment);
  if (bVar1) {
    AVar4 = cfd::core::Amount::CreateBySatoshiAmount(value_satoshi);
    local_168._0_8_ = AVar4.amount_;
    local_168[8] = AVar4.ignore_check_;
    cfd::core::ConfidentialValue::ConfidentialValue
              ((ConfidentialValue *)&local_1a8,(Amount *)local_168);
    cfd::core::ConfidentialValue::operator=(&value,(ConfidentialValue *)&local_1a8);
    cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&local_1a8);
  }
  else {
    std::__cxx11::string::string((string *)local_168,value_commitment,(allocator *)&local_a8);
    cfd::core::ConfidentialValue::ConfidentialValue
              ((ConfidentialValue *)&local_1a8,(string *)local_168);
    cfd::core::ConfidentialValue::operator=(&value,(ConfidentialValue *)&local_1a8);
    cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&local_1a8);
    std::__cxx11::string::~string((string *)local_168);
  }
  bVar1 = cfd::capi::IsEmptyString(script);
  iVar3 = 7;
  if (bVar1) {
    bVar1 = cfd::capi::IsEmptyString(pubkey);
    if (bVar1) goto LAB_0036cc58;
    std::__cxx11::string::string((string *)&local_1a8,pubkey,(allocator *)&local_a8);
    cfd::core::Pubkey::Pubkey((Pubkey *)local_168,(string *)&local_1a8);
    cfd::core::SigHashType::SigHashType(&local_6c,&sighash_type_obj);
    bVar1 = cfd::ConfidentialTransactionController::VerifyInputSignature
                      (&ctxc,&signature_obj,(Pubkey *)local_168,&txid_obj,vout,&local_6c,&value,
                       witness_version);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_168);
    this = &local_1a8;
  }
  else {
    std::__cxx11::string::string((string *)local_168,pubkey,&local_1a9);
    cfd::core::Pubkey::Pubkey((Pubkey *)&local_88,(string *)local_168);
    std::__cxx11::string::string((string *)&local_a8,script,&local_1aa);
    cfd::core::Script::Script(&local_1a8,&local_a8);
    version = 0x36cbe6;
    cfd::core::SigHashType::SigHashType(&local_3c,&sighash_type_obj);
    uVar5 = SUB84(&value,0);
    sighash_type_00.is_anyone_can_pay_ = (bool)(char)uVar5;
    sighash_type_00.is_fork_id_ = (bool)(char)((uint)uVar5 >> 8);
    sighash_type_00._10_2_ = (short)((uint)uVar5 >> 0x10);
    sighash_type_00._0_8_ = &local_3c;
    bVar1 = cfd::ConfidentialTransactionController::VerifyInputSignature
                      (&ctxc,&signature_obj,(Pubkey *)&local_88,&txid_obj,vout,&local_1a8,
                       sighash_type_00,(ConfidentialValue *)(ulong)(uint)witness_version,version);
    cfd::core::Script::~Script(&local_1a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_88);
    this = (Script *)local_168;
  }
  std::__cxx11::string::~string((string *)this);
  if (bVar1 != false) {
    iVar3 = 0;
  }
LAB_0036cc58:
  cfd::core::ConfidentialValue::~ConfidentialValue(&value);
  cfd::core::Txid::~Txid(&txid_obj);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&signature_obj);
  cfd::ConfidentialTransactionController::~ConfidentialTransactionController(&ctxc);
  return iVar3;
}

Assistant:

CFDC_API int CfdVerifyConfidentialTxSignature(
    void* handle, const char* tx_hex, const char* signature,
    const char* pubkey, const char* script, const char* txid, uint32_t vout,
    int sighash_type, bool sighash_anyone_can_pay, int64_t value_satoshi,
    const char* value_commitment, int witness_version) {
  bool work_result = false;
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (IsEmptyString(signature)) {
      warn(CFD_LOG_SOURCE, "signature is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. signature is null or empty.");
    }
    if (IsEmptyString(pubkey)) {
      warn(CFD_LOG_SOURCE, "pubkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null or empty.");
    }

    ConfidentialTransactionController ctxc(tx_hex);
    ByteData signature_obj(signature);
    Txid txid_obj(txid);
    SigHashType sighash_type_obj = SigHashType::Create(
        static_cast<uint8_t>(sighash_type), sighash_anyone_can_pay);
    ConfidentialValue value;
    if (!IsEmptyString(value_commitment)) {
      value = ConfidentialValue(value_commitment);
    } else {
      value = ConfidentialValue(Amount::CreateBySatoshiAmount(value_satoshi));
    }

    if (!IsEmptyString(script)) {
      work_result = ctxc.VerifyInputSignature(
          signature_obj, Pubkey(pubkey), txid_obj, vout, Script(script),
          sighash_type_obj, value,
          static_cast<WitnessVersion>(witness_version));
    } else if (!IsEmptyString(pubkey)) {
      work_result = ctxc.VerifyInputSignature(
          signature_obj, Pubkey(pubkey), txid_obj, vout, sighash_type_obj,
          value, static_cast<WitnessVersion>(witness_version));
    }

    if (!work_result) {
      return CfdErrorCode::kCfdSignVerificationError;
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}